

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

void __thiscall
MADPComponentDiscreteStates::SetNrStates(MADPComponentDiscreteStates *this,size_t nrS)

{
  string *description;
  ulong in_RSI;
  long in_RDI;
  Index i;
  value_type *in_stack_fffffffffffffef8;
  StateDistributionVector *in_stack_ffffffffffffff00;
  StateDiscrete *this_00;
  undefined4 in_stack_ffffffffffffff10;
  uint uVar1;
  Index i_00;
  StateDiscrete *in_stack_ffffffffffffff20;
  allocator<char> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator<char> local_99;
  string local_98 [120];
  uint local_20;
  ulong local_10;
  
  *(ulong *)(in_RDI + 0x10) = in_RSI;
  local_10 = in_RSI;
  std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::clear
            ((vector<StateDiscrete,_std::allocator<StateDiscrete>_> *)0xad5b79);
  if (*(long *)(in_RDI + 0x30) == 0) {
    in_stack_ffffffffffffff20 = (StateDiscrete *)operator_new(0x20);
    StateDistributionVector::StateDistributionVector(in_stack_ffffffffffffff00);
    *(StateDiscrete **)(in_RDI + 0x30) = in_stack_ffffffffffffff20;
  }
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0xad5beb);
  for (local_20 = 0; local_20 < local_10; local_20 = local_20 + 1) {
    description = (string *)(in_RDI + 0x18);
    i_00 = (Index)((ulong)&local_99 >> 0x20);
    uVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    this_00 = (StateDiscrete *)&stack0xffffffffffffff3f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    StateDiscrete::StateDiscrete
              (in_stack_ffffffffffffff20,i_00,(string *)CONCAT44(uVar1,in_stack_ffffffffffffff10),
               description);
    std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::push_back
              ((vector<StateDiscrete,_std::allocator<StateDiscrete>_> *)this_00,
               in_stack_fffffffffffffef8);
    StateDiscrete::~StateDiscrete(this_00);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator(&local_99);
    in_stack_ffffffffffffff30 = (allocator<char> *)0x0;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)this_00,
               (value_type_conflict3 *)in_stack_fffffffffffffef8);
  }
  *(undefined1 *)(in_RDI + 8) = 1;
  return;
}

Assistant:

void MADPComponentDiscreteStates::SetNrStates(size_t nrS)
{
    _m_nrStates = nrS;
    _m_stateVec.clear();
    if(_m_initialStateDistribution == 0)
        _m_initialStateDistribution = new StateDistributionVector();

    _m_initialStateDistribution->clear();
    for(Index i=0; i < nrS; i++)
    {
        _m_stateVec.push_back(StateDiscrete(i));
        _m_initialStateDistribution->push_back(0.0);
    }
    _m_initialized = true;
}